

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flowImpl.h
# Opt level: O1

void __thiscall FlowImpl::~FlowImpl(FlowImpl *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

~FlowImpl() override = default;